

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::WildcardPattern::WildcardPattern
          (WildcardPattern *this,string *pattern,CaseSensitive caseSensitivity)

{
  StringRef s;
  bool bVar1;
  undefined4 in_EDX;
  undefined4 *in_RDI;
  undefined7 in_stack_ffffffffffffff68;
  char in_stack_ffffffffffffff6f;
  string *in_stack_ffffffffffffff70;
  undefined4 *puVar2;
  string local_78 [24];
  string *in_stack_ffffffffffffffa0;
  WildcardPattern *in_stack_ffffffffffffffa8;
  string local_48 [72];
  
  *in_RDI = in_EDX;
  in_RDI[1] = 0;
  normaliseString(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  StringRef::StringRef
            ((StringRef *)in_stack_ffffffffffffff70,
             (string *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  s.m_start._7_1_ = in_stack_ffffffffffffff6f;
  s.m_start._0_7_ = in_stack_ffffffffffffff68;
  s.m_size = (size_type)in_stack_ffffffffffffff70;
  bVar1 = startsWith(s,'\0');
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)(in_RDI + 2));
    std::__cxx11::string::operator=((string *)(in_RDI + 2),local_48);
    std::__cxx11::string::~string(local_48);
    in_RDI[1] = 1;
  }
  bVar1 = endsWith(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
  if (bVar1) {
    puVar2 = in_RDI + 2;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_78,(ulong)puVar2);
    std::__cxx11::string::operator=((string *)(in_RDI + 2),local_78);
    std::__cxx11::string::~string(local_78);
    in_RDI[1] = in_RDI[1] | 2;
  }
  return;
}

Assistant:

WildcardPattern::WildcardPattern( std::string const& pattern,
                                      CaseSensitive caseSensitivity )
    :   m_caseSensitivity( caseSensitivity ),
        m_pattern( normaliseString( pattern ) )
    {
        if( startsWith( m_pattern, '*' ) ) {
            m_pattern = m_pattern.substr( 1 );
            m_wildcard = WildcardAtStart;
        }
        if( endsWith( m_pattern, '*' ) ) {
            m_pattern = m_pattern.substr( 0, m_pattern.size()-1 );
            m_wildcard = static_cast<WildcardPosition>( m_wildcard | WildcardAtEnd );
        }
    }